

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O0

void arrow_line_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Am_Style local_70;
  Am_Style ls;
  double wy;
  double wx;
  double ly;
  double lx;
  double d;
  int dy;
  int dx;
  int head_length;
  int head_width;
  int y2;
  int x2;
  int y1;
  int x1;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar8 = Am_Object::Get(self,0x8b,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x8c,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x8d,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar8);
  uVar4 = iVar3 + x_offset;
  pAVar8 = Am_Object::Get(self,0x8e,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar8);
  uVar5 = iVar3 + y_offset;
  pAVar8 = Am_Object::Get(self,0x91,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x90,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar8);
  d._4_4_ = uVar4 - (iVar1 + x_offset);
  iVar7 = uVar5 - (iVar2 + y_offset);
  lx = sqrt((double)(d._4_4_ * d._4_4_ + iVar7 * iVar7));
  if (lx < 1.0) {
    lx = 1.0;
    d._4_4_ = 1;
  }
  dVar9 = (double)(iVar6 * d._4_4_) / lx;
  dVar10 = (double)(iVar6 * iVar7) / lx;
  dVar11 = (double)(iVar3 * d._4_4_) / lx;
  ls.data = (Am_Style_Data *)((double)(iVar3 * iVar7) / lx);
  pAVar8 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&local_70,pAVar8);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&local_70,
             (ulong)(uint)(int)(((double)(int)uVar4 - dVar9) + (double)ls.data + 0.5),
             (ulong)(uint)(int)((((double)(int)uVar5 - dVar10) - dVar11) + 0.5),(ulong)uVar4,
             (ulong)uVar5,7);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&local_70,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
             (ulong)uVar4,(ulong)uVar5,7);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&local_70,
             (ulong)(uint)(int)((((double)(int)uVar4 - dVar9) - (double)ls.data) + 0.5),
             (ulong)(uint)(int)(((double)(int)uVar5 - dVar10) + dVar11 + 0.5),(ulong)uVar4,
             (ulong)uVar5,7);
  Am_Style::~Am_Style(&local_70);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, arrow_line_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int x1 = (int)self.Get(Am_X1) + x_offset;
  int y1 = (int)self.Get(Am_Y1) + y_offset;
  int x2 = (int)self.Get(Am_X2) + x_offset;
  int y2 = (int)self.Get(Am_Y2) + y_offset;
  int head_width = self.Get(Am_HEAD_WIDTH);
  int head_length = self.Get(Am_HEAD_LENGTH);
  int dx = x2 - x1;
  int dy = y2 - y1;
  double d = sqrt((double)(dx * dx + dy * dy));
  if (d < 1.0) {
    d = 1.0;
    dx = 1;
  }
  double lx = (head_length * dx) / d;
  double ly = (head_length * dy) / d;
  double wx = (head_width * dx) / d;
  double wy = (head_width * dy) / d;
  Am_Style ls = self.Get(Am_LINE_STYLE);

  //
  // WARNING!!	egcs 2.90.29 will hit an internal error if you swap the
  //			ordering of the first two calls.
  //
  drawonable->Draw_Line(ls, (int)(x2 - lx + wy + 0.5),
                        (int)(y2 - ly - wx + 0.5), x2, y2, Am_DRAW_MASK_COPY);
  drawonable->Draw_Line(ls, x1, y1, x2, y2, Am_DRAW_MASK_COPY);
  drawonable->Draw_Line(ls, (int)(x2 - lx - wy + 0.5),
                        (int)(y2 - ly + wx + 0.5), x2, y2, Am_DRAW_MASK_COPY);
}